

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityOutputTest.cpp
# Opt level: O1

void __thiscall
TEST_TeamCityOutputTest_TestNameEscaped_Ignore_Test::testBody
          (TEST_TeamCityOutputTest_TestNameEscaped_Ignore_Test *this)

{
  TestResult *pTVar1;
  UtestShell *pUVar2;
  char *pcVar3;
  TestTerminator *pTVar4;
  IgnoredUtestShell itst;
  
  IgnoredUtestShell::IgnoredUtestShell
            ((IgnoredUtestShell *)&stack0xffffffffffffffb8,"group","\'[]\n\r","file",10);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTeamCityOutputTest).result;
  (*pTVar1->_vptr_TestResult[6])(pTVar1,(IgnoredUtestShell *)&stack0xffffffffffffffb8);
  pUVar2 = UtestShell::getCurrent();
  pcVar3 = SimpleString::asCharString
                     (&((this->super_TEST_GROUP_CppUTestGroupTeamCityOutputTest).mock)->output);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[9])
            (pUVar2,
             "##teamcity[testStarted name=\'|\'|[|]|n|r\']\n##teamcity[testIgnored name=\'|\'|[|]|n|r\']\n"
             ,pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TeamCityOutputTest.cpp"
             ,0xd2,pTVar4);
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)&stack0xffffffffffffffb8);
  return;
}

Assistant:

TEST(TeamCityOutputTest, TestNameEscaped_Ignore)
{
	IgnoredUtestShell itst("group", "'[]\n\r", "file", 10);
	result->currentTestStarted(&itst);
	const char* expected =
		"##teamcity[testStarted name='|'|[|]|n|r']\n"
		"##teamcity[testIgnored name='|'|[|]|n|r']\n";
	STRCMP_EQUAL(expected, mock->getOutput().asCharString());
}